

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O3

void iutest::detail::iuUniversalPrinter<std::filesystem::file_status>::Print
               (file_status *value,iu_ostream *os)

{
  ostream *poVar1;
  file_type *in_RDX;
  file_status local_39;
  string local_38;
  
  local_39 = *value;
  FileSystemFileTypeToString_abi_cxx11_(&local_38,(detail *)&local_39,in_RDX);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(char *)CONCAT44(local_38._M_dataplus._M_p._4_4_,
                                          local_38._M_dataplus._M_p._0_4_),local_38._M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_38._M_dataplus._M_p._4_4_,local_38._M_dataplus._M_p._0_4_) !=
      &local_38.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_38._M_dataplus._M_p._4_4_,local_38._M_dataplus._M_p._0_4_),
                    local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p._0_4_ = *(undefined4 *)(value + 4);
  PrintTo((perms *)&local_38,os);
  return;
}

Assistant:

static void Print(const T& value, iu_ostream* os)
    {
        UniversalPrintTo(value, os);
    }